

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

ScriptContext * Js::ScriptContext::New(ThreadContext *threadContext)

{
  HeapAllocator *alloc;
  ScriptContext *pSVar1;
  TrackAllocData local_40;
  BasePtr<Js::ScriptContext> local_18;
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> scriptContext;
  ThreadContext *threadContext_local;
  
  scriptContext.super_BasePtr<Js::ScriptContext>.ptr =
       (BasePtr<Js::ScriptContext>)(BasePtr<Js::ScriptContext>)threadContext;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x37);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  pSVar1 = (ScriptContext *)new<Memory::HeapAllocator>(0x1470,alloc,0x350bd0);
  ScriptContext(pSVar1,(ThreadContext *)scriptContext.super_BasePtr<Js::ScriptContext>.ptr);
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator>::AutoPtr
            ((AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> *)&local_18,pSVar1);
  pSVar1 = BasePtr<Js::ScriptContext>::operator->(&local_18);
  InitializeAllocations(pSVar1);
  pSVar1 = BasePtr<Js::ScriptContext>::Detach(&local_18);
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> *)&local_18);
  return pSVar1;
}

Assistant:

ScriptContext * ScriptContext::New(ThreadContext * threadContext)
    {
        AutoPtr<ScriptContext> scriptContext(HeapNew(ScriptContext, threadContext));
        scriptContext->InitializeAllocations();
        return scriptContext.Detach();
    }